

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

void ExUtilDeleteCommandLineArguments(CommandLineArguments *args)

{
  char **in_RDI;
  
  if (in_RDI != (char **)0x0) {
    if (*(int *)(in_RDI + 4) != 0) {
      WebPFree((void *)0x104b93);
      WebPDataClear((WebPData *)0x104ba0);
    }
    ResetCommandLineArguments(args._4_4_,in_RDI,(CommandLineArguments *)0x104baf);
  }
  return;
}

Assistant:

void ExUtilDeleteCommandLineArguments(CommandLineArguments* const args) {
  if (args != NULL) {
    if (args->own_argv) {
      WebPFree((void*)args->argv);
      WebPDataClear(&args->argv_data);
    }
    ResetCommandLineArguments(0, NULL, args);
  }
}